

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

bool __thiscall IR::RegBVOpnd::IsEqualInternal(RegBVOpnd *this,Opnd *opnd)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((this->super_Opnd).m_kind != OpndKindRegBV) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x69c,"(m_kind == OpndKindRegBV)","m_kind == OpndKindRegBV");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((opnd->m_kind == OpndKindRegBV) && ((this->super_Opnd).m_type == opnd->m_type)) {
    bVar2 = (_func_int **)(this->m_value).word == opnd[1]._vptr_Opnd;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
RegBVOpnd::IsEqualInternal(Opnd *opnd)
{
    Assert(m_kind == OpndKindRegBV);
    if (!opnd->IsRegBVOpnd() || this->GetType() != opnd->GetType())
    {
        return false;
    }

    return m_value.Equal(opnd->AsRegBVOpnd()->m_value);
}